

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O1

int ov_pcm_seek_page(OggVorbis_File *vf,ogg_int64_t pos)

{
  ogg_stream_state *os;
  bool bVar1;
  ogg_int64_t *poVar2;
  ogg_int64_t *poVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ogg_int64_t *poVar8;
  long lVar9;
  ogg_int64_t oVar10;
  int iVar11;
  ogg_int64_t *offset;
  ogg_int64_t *poVar12;
  char cVar13;
  uint uVar14;
  uint uVar15;
  ogg_int64_t *poVar16;
  ogg_int64_t *poVar17;
  ogg_page og;
  ogg_page og_1;
  ogg_packet op;
  ogg_int64_t *local_f0;
  ogg_int64_t *local_e0;
  long local_d0;
  ogg_int64_t *local_c8;
  ogg_int64_t *local_b8;
  ogg_page local_a8;
  ogg_page local_88;
  ogg_packet local_60;
  
  local_d0 = ov_pcm_total(vf,-1);
  if (vf->ready_state < 2) {
    return -0x83;
  }
  if (vf->seekable == 0) {
    return -0x8a;
  }
  if (local_d0 < pos || pos < 0) {
    return -0x83;
  }
  uVar14 = vf->links;
  uVar4 = (int)uVar14 >> 0x1f & uVar14;
  uVar6 = uVar14 * 2;
  do {
    uVar6 = uVar6 - 2;
    uVar5 = uVar4;
    uVar15 = uVar4 - 1;
    if ((int)uVar14 < 1) break;
    local_d0 = local_d0 - *(long *)((long)vf->pcmlengths + ((ulong)uVar6 << 3 | 8));
    uVar15 = uVar14 - 1;
    uVar5 = uVar14;
    uVar14 = uVar15;
  } while (pos < local_d0);
  poVar17 = (ogg_int64_t *)vf->offsets[(int)uVar5];
  local_e0 = (ogg_int64_t *)vf->dataoffsets[(int)uVar15];
  local_c8 = (ogg_int64_t *)vf->pcmlengths[(int)(uVar15 * 2)];
  local_b8 = (ogg_int64_t *)(vf->pcmlengths[(int)(uVar15 * 2 + 1)] + (long)local_c8);
  if (local_e0 != poVar17) {
    bVar1 = false;
    poVar8 = local_b8;
    offset = (ogg_int64_t *)0x0;
LAB_001a9c12:
    if ((long)local_e0 < (long)poVar17) {
      lVar9 = (pos - local_d0) + (long)local_c8;
      local_f0 = (ogg_int64_t *)0xffffffffffffffff;
      do {
        poVar16 = local_e0;
        if ((0xffff < (long)poVar17 - (long)local_e0) &&
           (poVar16 = (ogg_int64_t *)
                      ((long)local_e0 +
                      (long)(((double)((long)poVar17 - (long)local_e0) *
                             (double)(lVar9 - (long)local_c8)) /
                            (double)((long)local_b8 - (long)local_c8)) + -0x10000),
           (long)poVar16 < (long)(local_e0 + 0x2000))) {
          poVar16 = local_e0;
        }
        uVar6 = _seek_helper(vf,(ogg_int64_t)poVar16);
        poVar8 = (ogg_int64_t *)(ulong)uVar6;
        poVar12 = poVar17;
        if (uVar6 == 0) {
          if ((long)local_e0 < (long)poVar17) {
            do {
              offset = (ogg_int64_t *)_get_next_page(vf,&local_a8,(long)poVar17 - vf->offset);
              poVar12 = poVar17;
              if (offset == (ogg_int64_t *)0xffffffffffffff80) {
                offset = (ogg_int64_t *)0xffffffffffffff80;
                poVar8 = (ogg_int64_t *)0xffffffffffffff80;
                goto LAB_001a9cc2;
              }
              if ((long)offset < 0) {
                poVar8 = local_e0;
                poVar12 = local_e0;
                if ((long)((long)local_e0 + 1U) < (long)poVar16) {
                  poVar12 = poVar17;
                  if (poVar16 == (ogg_int64_t *)0x0) goto LAB_001a9cc2;
                  poVar8 = poVar16 + -0x2000;
                  poVar16 = (ogg_int64_t *)((long)local_e0 + 1U);
                  if ((long)local_e0 < (long)poVar8) {
                    poVar16 = poVar8;
                  }
                  uVar6 = _seek_helper(vf,(ogg_int64_t)poVar16);
                  poVar8 = (ogg_int64_t *)(ulong)uVar6;
                  if (uVar6 != 0) {
                    offset = (ogg_int64_t *)(ulong)uVar6;
                    goto LAB_001a9cc2;
                  }
                  offset = (ogg_int64_t *)0x0;
                }
              }
              else {
                iVar7 = ogg_page_serialno(&local_a8);
                poVar8 = (ogg_int64_t *)(long)iVar7;
                cVar13 = '\b';
                poVar2 = offset;
                poVar3 = local_b8;
                if ((ogg_int64_t *)vf->serialnos[(int)uVar15] == poVar8) {
                  poVar8 = (ogg_int64_t *)ogg_page_granulepos(&local_a8);
                  if (poVar8 == (ogg_int64_t *)0xffffffffffffffff) {
                    cVar13 = '\b';
                  }
                  else if ((long)poVar8 < lVar9) {
                    local_e0 = (ogg_int64_t *)vf->offset;
                    cVar13 = (0xac44 < lVar9 - (long)poVar8) * '\t';
                    local_f0 = offset;
                    local_c8 = poVar8;
                    if (lVar9 - (long)poVar8 < 0xac45) {
                      poVar16 = local_e0;
                    }
                  }
                  else {
                    cVar13 = '\0';
                    poVar12 = local_e0;
                    if (((long)((long)local_e0 + 1U) < (long)poVar16) &&
                       (cVar13 = '\t', poVar12 = poVar16, poVar3 = poVar8,
                       poVar17 == (ogg_int64_t *)vf->offset)) {
                      poVar17 = poVar16 + -0x2000;
                      if ((long)(poVar16 + -0x2000) <= (long)local_e0) {
                        poVar17 = (ogg_int64_t *)((long)local_e0 + 1U);
                      }
                      uVar6 = _seek_helper(vf,(ogg_int64_t)poVar17);
                      poVar8 = (ogg_int64_t *)(ulong)uVar6;
                      cVar13 = (uVar6 != 0) * '\x05';
                      poVar2 = (ogg_int64_t *)(ulong)uVar6;
                      poVar12 = offset;
                      poVar16 = poVar17;
                      poVar3 = local_b8;
                    }
                  }
                }
                local_b8 = poVar3;
                offset = poVar2;
                bVar1 = true;
                if ((cVar13 != '\0') && (cVar13 != '\b')) {
                  if (cVar13 == '\t') {
                    cVar13 = '\0';
                  }
                  goto LAB_001a9ea8;
                }
              }
              poVar17 = poVar12;
            } while ((long)local_e0 < (long)poVar12);
          }
          else {
            offset = (ogg_int64_t *)0x0;
          }
          cVar13 = '\0';
        }
        else {
          offset = (ogg_int64_t *)(ulong)uVar6;
LAB_001a9cc2:
          cVar13 = '\x05';
        }
LAB_001a9ea8:
        if (cVar13 != '\0') goto LAB_001a9f52;
        poVar17 = poVar12;
      } while ((long)local_e0 < (long)poVar12);
    }
    else {
      local_f0 = (ogg_int64_t *)0xffffffffffffffff;
    }
    if (local_f0 == (ogg_int64_t *)0xffffffffffffffff) {
      if ((bVar1) && (poVar8 = vf->dataoffsets, local_e0 == (ogg_int64_t *)poVar8[(int)uVar15])) {
        iVar7 = ogg_page_serialno(&local_a8);
        if (vf->serialnos[(int)uVar15] == (long)iVar7) {
          vf->pcm_offset = local_d0;
          if (uVar15 == vf->current_link) {
            vorbis_synthesis_restart(&vf->vd);
          }
          else {
            vorbis_dsp_clear(&vf->vd);
            vorbis_block_clear(&vf->vb);
            vf->ready_state = 2;
            vf->current_link = uVar15;
            vf->current_serialno = vf->serialnos[(int)uVar15];
            vf->ready_state = 3;
          }
          ogg_stream_reset_serialno(&vf->os,(int)vf->current_serialno);
          iVar7 = ogg_stream_pagein(&vf->os,&local_a8);
          cVar13 = '\0';
        }
        else {
          cVar13 = '\x05';
        }
        goto LAB_001aa277;
      }
    }
    else {
      uVar6 = _seek_helper(vf,(ogg_int64_t)local_f0);
      vf->pcm_offset = -1;
      if (uVar6 != 0) goto LAB_001a9f4b;
      poVar8 = (ogg_int64_t *)_get_next_page(vf,&local_88,-1);
      offset = poVar8;
      if (-1 < (long)poVar8) {
        if (uVar15 == vf->current_link) {
          vorbis_synthesis_restart(&vf->vd);
        }
        else {
          vorbis_dsp_clear(&vf->vd);
          vorbis_block_clear(&vf->vb);
          vf->ready_state = 2;
          vf->current_link = uVar15;
          vf->current_serialno = vf->serialnos[(int)uVar15];
          vf->ready_state = 3;
        }
        os = &vf->os;
        ogg_stream_reset_serialno(os,(int)vf->current_serialno);
        ogg_stream_pagein(os,&local_88);
        do {
          uVar6 = ogg_stream_packetpeek(os,&local_60);
          poVar8 = (ogg_int64_t *)(ulong)uVar6;
          if (uVar6 == 0) {
            poVar8 = vf->dataoffsets;
            offset = local_f0;
            poVar17 = local_f0;
            poVar16 = local_f0;
            if (poVar8[(int)uVar15] < (long)local_f0) {
LAB_001aa08e:
              do {
                if ((long)poVar17 < 0x10001) {
                  poVar17 = (ogg_int64_t *)0x10000;
                }
                uVar6 = _seek_helper(vf,(ogg_int64_t)(poVar17 + -0x2000));
                poVar8 = (ogg_int64_t *)(ulong)uVar6;
                if (uVar6 == 0) {
                  lVar9 = vf->offset;
                  offset = (ogg_int64_t *)0xffffffffffffffff;
                  while (lVar9 < (long)poVar16) {
                    local_88.body = (uchar *)0x0;
                    local_88.body_len = 0;
                    local_88.header = (uchar *)0x0;
                    local_88.header_len = 0;
                    poVar8 = (ogg_int64_t *)_get_next_page(vf,&local_88,(long)poVar16 - vf->offset);
                    if (poVar8 == (ogg_int64_t *)0xffffffffffffff80) {
                      offset = (ogg_int64_t *)0xffffffffffffff80;
                      goto LAB_001aa12b;
                    }
                    if ((long)poVar8 < 0) break;
                    offset = poVar8;
                    lVar9 = vf->offset;
                  }
                  poVar17 = poVar17 + -0x2000;
                  if (offset == (ogg_int64_t *)0xffffffffffffffff) goto LAB_001aa08e;
                  if (local_88.header_len == 0) {
                    uVar6 = _seek_helper(vf,(ogg_int64_t)offset);
                    poVar8 = (ogg_int64_t *)(ulong)uVar6;
                    if (uVar6 == 0) {
                      poVar8 = (ogg_int64_t *)_get_next_page(vf,&local_88,0x10000);
                      if ((long)poVar8 < 0) {
                        offset = (ogg_int64_t *)0xffffffffffffff7f;
                      }
                    }
                    else {
                      offset = (ogg_int64_t *)(long)(int)uVar6;
                    }
                  }
                }
                else {
                  offset = (ogg_int64_t *)(long)(int)uVar6;
                }
LAB_001aa12b:
                if ((long)offset < 0) goto LAB_001aa272;
                iVar7 = ogg_page_serialno(&local_88);
                if ((vf->current_serialno == (long)iVar7) &&
                   ((oVar10 = ogg_page_granulepos(&local_88), -1 < oVar10 ||
                    (iVar7 = ogg_page_continued(&local_88), iVar7 == 0)))) {
                  iVar7 = ov_raw_seek(vf,(ogg_int64_t)offset);
                  cVar13 = '\x01';
                  goto LAB_001aa277;
                }
                poVar8 = vf->dataoffsets;
                poVar17 = offset;
                poVar16 = offset;
              } while (poVar8[(int)uVar15] < (long)offset);
            }
          }
          else {
            offset = (ogg_int64_t *)(long)(int)uVar6;
          }
          if ((long)offset < 0) {
            offset = (ogg_int64_t *)0xffffffffffffff78;
            break;
          }
          if (local_60.granulepos != -1) goto LAB_001aa2f8;
          ogg_stream_packetout(os,(ogg_packet *)0x0);
        } while( true );
      }
    }
LAB_001aa272:
    iVar7 = (int)poVar8;
    cVar13 = '\x05';
    goto LAB_001aa277;
  }
  uVar6 = _seek_helper(vf,(ogg_int64_t)local_e0);
  if (uVar6 == 0) {
    poVar8 = (ogg_int64_t *)_get_next_page(vf,&local_a8,1);
    bVar1 = true;
    offset = poVar8;
    if (-1 < (long)poVar8) goto LAB_001a9c12;
  }
  else {
LAB_001a9f4b:
    poVar8 = (ogg_int64_t *)(ulong)uVar6;
  }
  cVar13 = '\x05';
  offset = poVar8;
LAB_001a9f52:
  iVar7 = (int)poVar8;
LAB_001aa277:
  iVar11 = (int)offset;
  if (cVar13 != '\x05') {
    if (cVar13 != '\0') {
      return iVar7;
    }
    iVar11 = -0x81;
    if (vf->pcm_offset <= pos) {
      oVar10 = ov_pcm_total(vf,-1);
      iVar11 = -0x81;
      if (pos <= oVar10) {
        vf->bittrack = 0.0;
        vf->samptrack = 0.0;
        return 0;
      }
    }
  }
  vf->pcm_offset = -1;
  vorbis_dsp_clear(&vf->vd);
  vorbis_block_clear(&vf->vb);
  vf->ready_state = 2;
  return iVar11;
LAB_001aa2f8:
  local_60.granulepos = local_60.granulepos - vf->pcmlengths[(long)vf->current_link * 2];
  cVar13 = '\0';
  if (local_60.granulepos < 1) {
    local_60.granulepos = 0;
  }
  poVar8 = (ogg_int64_t *)(local_60.granulepos + local_d0);
  vf->pcm_offset = (ogg_int64_t)poVar8;
  goto LAB_001a9f52;
}

Assistant:

int ov_pcm_seek_page(OggVorbis_File *vf,ogg_int64_t pos){
  int link=-1;
  ogg_int64_t result=0;
  ogg_int64_t total=ov_pcm_total(vf,-1);

  if(vf->ready_state<OPENED)return(OV_EINVAL);
  if(!vf->seekable)return(OV_ENOSEEK);

  if(pos<0 || pos>total)return(OV_EINVAL);

  /* which bitstream section does this pcm offset occur in? */
  for(link=vf->links-1;link>=0;link--){
    total-=vf->pcmlengths[link*2+1];
    if(pos>=total)break;
  }

  /* Search within the logical bitstream for the page with the highest
     pcm_pos preceding pos.  If we're looking for a position on the
     first page, bisection will halt without finding our position as
     it's before the first explicit granulepos fencepost. That case is
     handled separately below.

     There is a danger here; missing pages or incorrect frame number
     information in the bitstream could make our task impossible.
     Account for that (it would be an error condition) */

  /* new search algorithm originally by HB (Nicholas Vinen) */

  {
    ogg_int64_t end=vf->offsets[link+1];
    ogg_int64_t begin=vf->dataoffsets[link];
    ogg_int64_t begintime = vf->pcmlengths[link*2];
    ogg_int64_t endtime = vf->pcmlengths[link*2+1]+begintime;
    ogg_int64_t target=pos-total+begintime;
    ogg_int64_t best=-1;
    int         got_page=0;

    ogg_page og;

    /* if we have only one page, there will be no bisection.  Grab the page here */
    if(begin==end){
      result=_seek_helper(vf,begin);
      if(result) goto seek_error;

      result=_get_next_page(vf,&og,1);
      if(result<0) goto seek_error;

      got_page=1;
    }

    /* bisection loop */
    while(begin<end){
      ogg_int64_t bisect;

      if(end-begin<CHUNKSIZE){
        bisect=begin;
      }else{
        /* take a (pretty decent) guess. */
        bisect=begin +
          (ogg_int64_t)((double)(target-begintime)*(end-begin)/(endtime-begintime))
          - CHUNKSIZE;
        if(bisect<begin+CHUNKSIZE)
          bisect=begin;
      }

      result=_seek_helper(vf,bisect);
      if(result) goto seek_error;

      /* read loop within the bisection loop */
      while(begin<end){
        result=_get_next_page(vf,&og,end-vf->offset);
        if(result==OV_EREAD) goto seek_error;
        if(result<0){
          /* there is no next page! */
          if(bisect<=begin+1)
              /* No bisection left to perform.  We've either found the
                 best candidate already or failed. Exit loop. */
            end=begin;
          else{
            /* We tried to load a fraction of the last page; back up a
               bit and try to get the whole last page */
            if(bisect==0) goto seek_error;
            bisect-=CHUNKSIZE;

            /* don't repeat/loop on a read we've already performed */
            if(bisect<=begin)bisect=begin+1;

            /* seek and cntinue bisection */
            result=_seek_helper(vf,bisect);
            if(result) goto seek_error;
          }
        }else{
          ogg_int64_t granulepos;
          got_page=1;

          /* got a page. analyze it */
          /* only consider pages from primary vorbis stream */
          if(ogg_page_serialno(&og)!=vf->serialnos[link])
            continue;

          /* only consider pages with the granulepos set */
          granulepos=ogg_page_granulepos(&og);
          if(granulepos==-1)continue;

          if(granulepos<target){
            /* this page is a successful candidate! Set state */

            best=result;  /* raw offset of packet with granulepos */
            begin=vf->offset; /* raw offset of next page */
            begintime=granulepos;

            /* if we're before our target but within a short distance,
               don't bisect; read forward */
            if(target-begintime>44100)break;

            bisect=begin; /* *not* begin + 1 as above */
          }else{

            /* This is one of our pages, but the granpos is
               post-target; it is not a bisection return
               candidate. (The only way we'd use it is if it's the
               first page in the stream; we handle that case later
               outside the bisection) */
            if(bisect<=begin+1){
              /* No bisection left to perform.  We've either found the
                 best candidate already or failed. Exit loop. */
              end=begin;
            }else{
              if(end==vf->offset){
                /* bisection read to the end; use the known page
                   boundary (result) to update bisection, back up a
                   little bit, and try again */
                end=result;
                bisect-=CHUNKSIZE;
                if(bisect<=begin)bisect=begin+1;
                result=_seek_helper(vf,bisect);
                if(result) goto seek_error;
              }else{
                /* Normal bisection */
                end=bisect;
                endtime=granulepos;
                break;
              }
            }
          }
        }
      }
    }

    /* Out of bisection: did it 'fail?' */
    if(best == -1){

      /* Check the 'looking for data in first page' special case;
         bisection would 'fail' because our search target was before the
         first PCM granule position fencepost. */

      if(got_page &&
         begin == vf->dataoffsets[link] &&
         ogg_page_serialno(&og)==vf->serialnos[link]){

        /* Yes, this is the beginning-of-stream case. We already have
           our page, right at the beginning of PCM data.  Set state
           and return. */

        vf->pcm_offset=total;

        if(link!=vf->current_link){
          /* Different link; dump entire decode machine */
          _decode_clear(vf);

          vf->current_link=link;
          vf->current_serialno=vf->serialnos[link];
          vf->ready_state=STREAMSET;

        }else{
          vorbis_synthesis_restart(&vf->vd);
        }

        ogg_stream_reset_serialno(&vf->os,vf->current_serialno);
        ogg_stream_pagein(&vf->os,&og);

      }else
        goto seek_error;

    }else{

      /* Bisection found our page. seek to it, update pcm offset. Easier case than
         raw_seek, don't keep packets preceding granulepos. */

      ogg_page og;
      ogg_packet op;

      /* seek */
      result=_seek_helper(vf,best);
      vf->pcm_offset=-1;
      if(result) goto seek_error;
      result=_get_next_page(vf,&og,-1);
      if(result<0) goto seek_error;

      if(link!=vf->current_link){
        /* Different link; dump entire decode machine */
        _decode_clear(vf);

        vf->current_link=link;
        vf->current_serialno=vf->serialnos[link];
        vf->ready_state=STREAMSET;

      }else{
        vorbis_synthesis_restart(&vf->vd);
      }

      ogg_stream_reset_serialno(&vf->os,vf->current_serialno);
      ogg_stream_pagein(&vf->os,&og);

      /* pull out all but last packet; the one with granulepos */
      while(1){
        result=ogg_stream_packetpeek(&vf->os,&op);
        if(result==0){
          /* No packet returned; we exited the bisection with 'best'
             pointing to a page with a granule position, so the packet
             finishing this page ('best') originated on a preceding
             page. Keep fetching previous pages until we get one with
             a granulepos or without the 'continued' flag set.  Then
             just use raw_seek for simplicity. */
          /* Do not rewind past the beginning of link data; if we do,
             it's either a bug or a broken stream */
          result=best;
          while(result>vf->dataoffsets[link]){
            result=_get_prev_page(vf,result,&og);
            if(result<0) goto seek_error;
            if(ogg_page_serialno(&og)==vf->current_serialno &&
               (ogg_page_granulepos(&og)>-1 ||
                !ogg_page_continued(&og))){
              return ov_raw_seek(vf,result);
            }
          }
        }
        if(result<0){
          result = OV_EBADPACKET;
          goto seek_error;
        }
        if(op.granulepos!=-1){
          vf->pcm_offset=op.granulepos-vf->pcmlengths[vf->current_link*2];
          if(vf->pcm_offset<0)vf->pcm_offset=0;
          vf->pcm_offset+=total;
          break;
        }else
          result=ogg_stream_packetout(&vf->os,NULL);
      }
    }
  }

  /* verify result */
  if(vf->pcm_offset>pos || pos>ov_pcm_total(vf,-1)){
    result=OV_EFAULT;
    goto seek_error;
  }
  vf->bittrack=0.f;
  vf->samptrack=0.f;
  return(0);

 seek_error:
  /* dump machine so we're in a known state */
  vf->pcm_offset=-1;
  _decode_clear(vf);
  return (int)result;
}